

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherBase<void_*const_&> * __thiscall
testing::internal::MatcherBase<void_*const_&>::operator=
          (MatcherBase<void_*const_&> *this,MatcherBase<void_*const_&> *other)

{
  MatcherBase<void_*const_&> *other_local;
  MatcherBase<void_*const_&> *this_local;
  
  if (this != other) {
    Destroy(this);
    this->vtable_ = other->vtable_;
    this->buffer_ = other->buffer_;
    other->vtable_ = (VTable *)0x0;
  }
  return this;
}

Assistant:

MatcherBase& operator=(MatcherBase&& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    other.vtable_ = nullptr;
    return *this;
  }